

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plastic.cpp
# Opt level: O3

void __thiscall
phyr::PlasticMaterial::computeScatteringFunctions
          (PlasticMaterial *this,SurfaceInteraction *si,MemoryPool *pool,TransportMode mode,
          bool allowMultipleLobes)

{
  int iVar1;
  element_type *peVar2;
  element_type *peVar3;
  BSDF *pBVar4;
  BxDF *pBVar5;
  undefined8 *puVar6;
  _func_int **pp_Var7;
  ulong uVar8;
  long lVar9;
  _func_int *extraout_XMM0_Qa;
  _func_int *p_Var10;
  double dVar11;
  undefined1 auVar12 [16];
  CoefficientSpectrum<60> cs_1;
  CoefficientSpectrum<60> cs;
  double local_5c8;
  double adStack_5c0 [59];
  double local_3e8;
  double adStack_3e0 [59];
  undefined1 local_208 [480];
  
  pBVar4 = (BSDF *)MemoryPool::alloc(pool,0xb0);
  BSDF::BSDF(pBVar4,si,1.0);
  si->bsdf = pBVar4;
  peVar2 = (this->Kd).
           super___shared_ptr<phyr::Texture<phyr::SampledSpectrum>,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr;
  (**peVar2->_vptr_Texture)(local_208,peVar2,si);
  lVar9 = 0;
  memset(&local_3e8,0,0x1e0);
  do {
    auVar12 = maxpd(ZEXT816(0),*(undefined1 (*) [16])(local_208 + lVar9 * 8));
    *(undefined1 (*) [16])(&local_3e8 + lVar9) = auVar12;
    lVar9 = lVar9 + 2;
  } while (lVar9 != 0x3c);
  if ((local_3e8 == 0.0) && (!NAN(local_3e8))) {
    uVar8 = 0xffffffffffffffff;
    do {
      if (uVar8 == 0x3a) goto LAB_0012cfa5;
      lVar9 = uVar8 + 1;
      uVar8 = uVar8 + 1;
    } while ((adStack_3e0[lVar9] == 0.0) && (!NAN(adStack_3e0[lVar9])));
    if (0x3a < uVar8) goto LAB_0012cfa5;
  }
  pBVar4 = si->bsdf;
  pBVar5 = (BxDF *)MemoryPool::alloc(pool,0x1f0);
  pBVar5->type = BSDF_DIFFUSE|BSDF_REFLECTION;
  pBVar5->_vptr_BxDF = (_func_int **)&PTR__BxDF_001a9d58;
  memcpy(pBVar5 + 1,&local_3e8,0x1e0);
  iVar1 = pBVar4->nBxDFs;
  pBVar4->nBxDFs = iVar1 + 1;
  pBVar4->bxdfs[iVar1] = pBVar5;
LAB_0012cfa5:
  peVar2 = (this->Ks).
           super___shared_ptr<phyr::Texture<phyr::SampledSpectrum>,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr;
  (**peVar2->_vptr_Texture)(local_208,peVar2,si);
  lVar9 = 0;
  memset(&local_5c8,0,0x1e0);
  do {
    auVar12 = maxpd(ZEXT816(0),*(undefined1 (*) [16])(local_208 + lVar9 * 8));
    *(undefined1 (*) [16])(&local_5c8 + lVar9) = auVar12;
    lVar9 = lVar9 + 2;
  } while (lVar9 != 0x3c);
  if ((local_5c8 == 0.0) && (!NAN(local_5c8))) {
    uVar8 = 0xffffffffffffffff;
    do {
      if (uVar8 == 0x3a) {
        return;
      }
      lVar9 = uVar8 + 1;
      uVar8 = uVar8 + 1;
    } while ((adStack_5c0[lVar9] == 0.0) && (!NAN(adStack_5c0[lVar9])));
    if (0x3a < uVar8) {
      return;
    }
  }
  puVar6 = (undefined8 *)MemoryPool::alloc(pool,0x18);
  *puVar6 = &PTR_evaluate_001aa5a8;
  puVar6[1] = 0x3ff8000000000000;
  puVar6[2] = 0x3ff0000000000000;
  peVar3 = (this->roughness).super___shared_ptr<phyr::Texture<double>,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr;
  (**peVar3->_vptr_Texture)(peVar3,si);
  p_Var10 = extraout_XMM0_Qa;
  if (this->remapRoughness == true) {
    p_Var10 = (_func_int *)0x3f50624dd2f1a9fc;
    if (0.001 <= (double)extraout_XMM0_Qa) {
      p_Var10 = extraout_XMM0_Qa;
    }
    dVar11 = log((double)p_Var10);
    p_Var10 = (_func_int *)
              (dVar11 * 0.0006407109904102981 * dVar11 * dVar11 * dVar11 +
              dVar11 * 0.017120100557804108 * dVar11 * dVar11 +
              dVar11 * 0.17339999973773956 * dVar11 +
              dVar11 * 0.8199549913406372 + 1.6214200258255005);
  }
  pp_Var7 = (_func_int **)MemoryPool::alloc(pool,0x20);
  *(undefined1 *)(pp_Var7 + 1) = 1;
  *pp_Var7 = (_func_int *)&PTR__MicrofacetDistribution_001aa940;
  pp_Var7[2] = p_Var10;
  pp_Var7[3] = p_Var10;
  pBVar5 = (BxDF *)MemoryPool::alloc(pool,0x200);
  pBVar5->type = BSDF_GLOSSY|BSDF_REFLECTION;
  pBVar5->_vptr_BxDF = (_func_int **)&PTR__BxDF_001aa7c8;
  memcpy(pBVar5 + 1,&local_5c8,0x1e0);
  pBVar5[0x1f]._vptr_BxDF = pp_Var7;
  *(undefined8 **)&pBVar5[0x1f].type = puVar6;
  pBVar4 = si->bsdf;
  iVar1 = pBVar4->nBxDFs;
  pBVar4->nBxDFs = iVar1 + 1;
  pBVar4->bxdfs[iVar1] = pBVar5;
  return;
}

Assistant:

void PlasticMaterial::computeScatteringFunctions(SurfaceInteraction* si,
                                                 MemoryPool& pool, TransportMode mode,
                                                 bool allowMultipleLobes) const {
    si->bsdf = POOL_ALLOC(pool, BSDF)(*si);
    // Initialize diffuse component of plastic material
    Spectrum kd = Kd->evaluate(*si).clamp();
    if (!kd.isBlack())
        si->bsdf->add(POOL_ALLOC(pool, LambertianReflection)(kd));

    // Initialize specular component of plastic material
    Spectrum ks = Ks->evaluate(*si).clamp();
    if (!ks.isBlack()) {
        Fresnel* fresnel = POOL_ALLOC(pool, FresnelDielectric)(1.5f, 1.f);
        // Create microfacet distribution {distrib} for plastic material
        Real rough = roughness->evaluate(*si);
        if (remapRoughness)
            rough = TrowbridgeReitzDistribution::roughnessToAlpha(rough);
        MicrofacetDistribution *distrib =
            POOL_ALLOC(pool, TrowbridgeReitzDistribution)(rough, rough);
        BxDF* spec = POOL_ALLOC(pool, MicrofacetReflection)(ks, distrib, fresnel);
        si->bsdf->add(spec);
    }
}